

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O1

int mz_uncompress2(uchar *pDest,mz_ulong *pDest_len,uchar *pSource,mz_ulong *pSource_len)

{
  int iVar1;
  int iVar2;
  mz_stream stream;
  mz_stream local_98;
  
  local_98.adler = 0;
  local_98.reserved = 0;
  local_98.opaque = (void *)0x0;
  local_98.data_type = 0;
  local_98._92_4_ = 0;
  local_98.zalloc = (mz_alloc_func)0x0;
  local_98.zfree = (mz_free_func)0x0;
  local_98.msg = (char *)0x0;
  local_98.state = (mz_internal_state *)0x0;
  local_98.total_out = 0;
  local_98.total_in = 0;
  iVar1 = -10000;
  if ((*pDest_len | *pSource_len) >> 0x20 == 0) {
    local_98._8_8_ = *pSource_len & 0xffffffff;
    local_98._32_8_ = *pDest_len & 0xffffffff;
    local_98.next_in = pSource;
    local_98.next_out = pDest;
    iVar1 = mz_inflateInit2(&local_98,0xf);
    if (iVar1 == 0) {
      iVar2 = mz_inflate(&local_98,4);
      *pSource_len = *pSource_len - (local_98._8_8_ & 0xffffffff);
      if (iVar2 == 1) {
        *pDest_len = local_98.total_out;
        iVar1 = 0;
        if (local_98.state != (mz_internal_state *)0x0) {
          (*local_98.zfree)(local_98.opaque,local_98.state);
        }
      }
      else {
        if (local_98.state != (mz_internal_state *)0x0) {
          (*local_98.zfree)(local_98.opaque,local_98.state);
        }
        iVar1 = -3;
        if (iVar2 != -5 || local_98.avail_in != 0) {
          iVar1 = iVar2;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int mz_uncompress2(unsigned char *pDest, mz_ulong *pDest_len,
                   const unsigned char *pSource, mz_ulong *pSource_len) {
  mz_stream stream;
  int status;
  memset(&stream, 0, sizeof(stream));

#if defined(__MINGW32__) || defined(__MINGW64__) || defined(__WATCOMC__)
  /* In case mz_ulong is 64-bits (argh I hate longs). */
#else
  if ((mz_uint64)(*pSource_len | *pDest_len) > 0xFFFFFFFFU)
    return MZ_PARAM_ERROR;
#endif
  stream.next_in = pSource;
  stream.avail_in = (mz_uint32)*pSource_len;
  stream.next_out = pDest;
  stream.avail_out = (mz_uint32)*pDest_len;

  status = mz_inflateInit(&stream);
  if (status != MZ_OK)
    return status;

  status = mz_inflate(&stream, MZ_FINISH);
  *pSource_len = *pSource_len - stream.avail_in;
  if (status != MZ_STREAM_END) {
    mz_inflateEnd(&stream);
    return ((status == MZ_BUF_ERROR) && (!stream.avail_in)) ? MZ_DATA_ERROR
                                                            : status;
  }
  *pDest_len = stream.total_out;

  return mz_inflateEnd(&stream);
}